

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void liblogger::LogManager::Remove(shared_ptr<liblogger::ILogger> *Log)

{
  LogException *this;
  long lVar1;
  LogManagerScopedLock lock;
  allocator<char> local_41;
  string local_40;
  
  Lock();
  lVar1 = DAT_00154d20;
  lock.m_locked = true;
  std::__cxx11::
  list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>::
  remove((list<std::shared_ptr<liblogger::ILogger>,_std::allocator<std::shared_ptr<liblogger::ILogger>_>_>
          *)&m_loggers_abi_cxx11_,(char *)Log);
  if (lVar1 != DAT_00154d20) {
    LogManagerScopedLock::~LogManagerScopedLock(&lock);
    return;
  }
  this = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"LogManager::Remove cannot find logging module",&local_41);
  LogException::LogException(this,&local_40);
  __cxa_throw(this,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void LogManager::Remove(std::shared_ptr<ILogger> Log)
{
	LogManagerScopedLock lock = LogManagerScopedLock();
	size_t size = m_loggers.size();
	m_loggers.remove(Log);
	if (size == m_loggers.size())
		throw(LogException("LogManager::Remove cannot find logging module"));
#ifdef DEBUG
	std::string str = Log->GetName();
	Logger(LOGGER_DEBUG, "Removed Logger: %s", str.c_str());
#endif
}